

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh8_factory.cpp
# Opt level: O2

Intersectors * __thiscall
embree::BVH8Factory::BVH8InstanceArrayIntersectors
          (Intersectors *__return_storage_ptr__,BVH8Factory *this,BVH8 *bvh)

{
  Intersector16 local_30;
  
  (__return_storage_ptr__->collider).name = (char *)0x0;
  (__return_storage_ptr__->intersector1).intersect = (IntersectFunc)0x0;
  __return_storage_ptr__->leafIntersector = (void *)0x0;
  (__return_storage_ptr__->collider).collide = (CollideFunc)0x0;
  (__return_storage_ptr__->intersector1).occluded = (OccludedFunc)0x0;
  memset(&(__return_storage_ptr__->intersector1).name,0,0xe0);
  __return_storage_ptr__->ptr = &bvh->super_AccelData;
  (*this->BVH8InstanceArrayIntersector1)(&__return_storage_ptr__->intersector1);
  (*this->BVH8InstanceArrayIntersector4Chunk)((Intersector4 *)&local_30);
  (__return_storage_ptr__->intersector4).name = local_30.name;
  *(undefined4 *)&(__return_storage_ptr__->intersector4).intersect = local_30.intersect._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->intersector4).intersect + 4) =
       local_30.intersect._4_4_;
  *(undefined4 *)&(__return_storage_ptr__->intersector4).occluded = local_30.occluded._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->intersector4).occluded + 4) =
       local_30.occluded._4_4_;
  (*this->BVH8InstanceArrayIntersector8Chunk)((Intersector8 *)&local_30);
  (__return_storage_ptr__->intersector8).name = local_30.name;
  *(undefined4 *)&(__return_storage_ptr__->intersector8).intersect = local_30.intersect._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->intersector8).intersect + 4) =
       local_30.intersect._4_4_;
  *(undefined4 *)&(__return_storage_ptr__->intersector8).occluded = local_30.occluded._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->intersector8).occluded + 4) =
       local_30.occluded._4_4_;
  (*this->BVH8InstanceArrayIntersector16Chunk)(&local_30);
  (__return_storage_ptr__->intersector16).name = local_30.name;
  (__return_storage_ptr__->intersector16).intersect =
       (IntersectFunc16)CONCAT44(local_30.intersect._4_4_,local_30.intersect._0_4_);
  (__return_storage_ptr__->intersector16).occluded =
       (OccludedFunc16)CONCAT44(local_30.occluded._4_4_,local_30.occluded._0_4_);
  return __return_storage_ptr__;
}

Assistant:

Accel::Intersectors BVH8Factory::BVH8InstanceArrayIntersectors(BVH8* bvh)
  {
    Accel::Intersectors intersectors;
    intersectors.ptr = bvh;
    intersectors.intersector1  = BVH8InstanceArrayIntersector1();
#if defined (EMBREE_RAY_PACKETS)
    intersectors.intersector4  = BVH8InstanceArrayIntersector4Chunk();
    intersectors.intersector8  = BVH8InstanceArrayIntersector8Chunk();
    intersectors.intersector16 = BVH8InstanceArrayIntersector16Chunk();
#endif
    return intersectors;
  }